

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_package_fake.hxx
# Opt level: O2

int wait_for_sm_exec(vector<RaftPkg_*,_std::allocator<RaftPkg_*>_> *pkgs,size_t timeout_sec)

{
  bool bVar1;
  int iVar2;
  GcFunc gc_pkgs;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  function<void_()> local_28;
  
  std::mutex::lock(&pkgs_to_watch_lock);
  std::vector<RaftPkg_*,_std::allocator<RaftPkg_*>_>::operator=(&pkgs_to_watch,pkgs);
  pthread_mutex_unlock((pthread_mutex_t *)&pkgs_to_watch_lock);
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_package_fake.hxx:189:31)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_package_fake.hxx:189:31)>
             ::_M_manager;
  std::function<void_()>::function(&local_28,(function<void_()> *)&local_48);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  iVar2 = 0;
  LOCK();
  ea_wait_for_commit.status._M_i = idle;
  UNLOCK();
  LOCK();
  commit_done._M_base._M_i = (__atomic_base<bool>)false;
  UNLOCK();
  bVar1 = check_pkgs();
  if (!bVar1) {
    nuraft::EventAwaiter::wait_us(&ea_wait_for_commit,3000000);
    iVar2 = -(~(uint)(byte)commit_done._M_base._M_i & 1);
  }
  TestSuite::GcFunc::~GcFunc((GcFunc *)&local_28);
  return iVar2;
}

Assistant:

static int ATTR_UNUSED wait_for_sm_exec(const std::vector<RaftPkg*>& pkgs,
                                        size_t timeout_sec)
{
    {
        std::lock_guard<std::mutex> l(pkgs_to_watch_lock);
        pkgs_to_watch = pkgs;
    }
    TestSuite::GcFunc gc_pkgs([&]() {
        // Auto clear.
        std::lock_guard<std::mutex> l(pkgs_to_watch_lock);
        pkgs_to_watch.clear();
    });

    ea_wait_for_commit.reset();
    commit_done = false;
    if (check_pkgs()) {
        // Already executed even before sleeping.
        return 0;
    }
    ea_wait_for_commit.wait_ms(timeout_sec * 1000);

    if (commit_done) {
        return 0;
    }
    return -1;
}